

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::block_statement::print(block_statement *this,wostream *os)

{
  __uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_> _Var1;
  wostream *pwVar2;
  char *pcVar3;
  ulong uVar4;
  
  pwVar2 = std::operator<<(os,"block_statement{");
  pcVar3 = "non-strict";
  if (this->strict_mode_ != false) {
    pcVar3 = "strict";
  }
  pwVar2 = std::operator<<(pwVar2,pcVar3);
  std::operator<<(pwVar2,", {");
  if ((this->l_).
      super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->l_).
      super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      if (uVar4 != 0) {
        std::operator<<(os,", ");
      }
      _Var1._M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
      super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
           (this->l_).
           super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t;
      (**(code **)(*(long *)_Var1._M_t.
                            super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                            .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 0x10))
                (_Var1._M_t.
                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                 super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,os);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->l_).
                                   super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->l_).
                                   super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::operator<<(os,"}}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "block_statement{" << (strict_mode_ ? "strict" : "non-strict") << ", {";
        for (size_t i = 0; i < l_.size(); ++i) {
            if (i) os << ", ";
            os << *l_[i];
        }
        os << "}}";
    }